

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::TestCase::UnshuffleTests(TestCase *this)

{
  undefined1 auVar1 [64];
  pointer piVar2;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  
  piVar2 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  if (lVar3 != 0) {
    auVar5 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar6 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar7 = vpmovsxbd_avx512f(_DAT_00155020);
    auVar8 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar9 = vpbroadcastd_avx512f(ZEXT416(0x10));
    lVar3 = lVar3 >> 2;
    auVar10 = vpbroadcastq_avx512f();
    uVar4 = 0;
    do {
      vpcmpuq_avx512f(auVar6,auVar10,2);
      vpcmpuq_avx512f(auVar5,auVar10,2);
      auVar6 = vpaddq_avx512f(auVar6,auVar8);
      auVar5 = vpaddq_avx512f(auVar5,auVar8);
      auVar1 = vmovdqu32_avx512f(auVar7);
      *(undefined1 (*) [64])(piVar2 + uVar4) = auVar1;
      uVar4 = uVar4 + 0x10;
      auVar7 = vpaddd_avx512f(auVar7,auVar9);
    } while ((lVar3 + (ulong)(lVar3 == 0) + 0xf & 0xfffffffffffffff0) != uVar4);
  }
  return;
}

Assistant:

void TestCase::UnshuffleTests() {
  for (size_t i = 0; i < test_indices_.size(); i++) {
    test_indices_[i] = static_cast<int>(i);
  }
}